

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O0

int Inter_ManCheckInitialState(Aig_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int nRealPis;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Abc_Cex_t *pAVar4;
  Aig_Obj_t *pObj_00;
  int local_34;
  int status;
  int i;
  sat_solver *pSat;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *p_local;
  
  iVar2 = Saig_ManRegNum(p);
  p_00 = Cnf_Derive(p,iVar2);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,1);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar2 == 1) {
      iVar3 = Aig_ManRegNum(p);
      nRealPis = Saig_ManPiNum(p);
      pAVar4 = Abc_CexAlloc(iVar3,nRealPis,1);
      p->pSeqModel = pAVar4;
      for (local_34 = 0; iVar3 = Saig_ManPiNum(p), local_34 < iVar3; local_34 = local_34 + 1) {
        pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_34);
        piVar1 = p_00->pVarNums;
        iVar3 = Aig_ObjId(pObj_00);
        iVar3 = sat_solver_var_value(s,piVar1[iVar3]);
        if (iVar3 != 0) {
          pAVar4 = p->pSeqModel;
          iVar3 = Aig_ManRegNum(p);
          Abc_InfoSetBit((uint *)(pAVar4 + 1),iVar3 + local_34);
        }
      }
    }
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
    p_local._4_4_ = (uint)(iVar2 == 1);
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Returns 1 if the property fails in the initial state.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Inter_ManCheckInitialState( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    //abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 1 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return 0;
    }
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    //ABC_PRT( "Time", Abc_Clock() - clk );
    if ( status == l_True )
    {
        p->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), 1 );
        Saig_ManForEachPi( p, pObj, i )
            if ( sat_solver_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pObj)] ) )
                Abc_InfoSetBit( p->pSeqModel->pData, Aig_ManRegNum(p) + i );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return status == l_True;
}